

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  CURLcode CVar1;
  char *pcVar2;
  char *local_80;
  char *local_78;
  char *local_70;
  char *pcStack_48;
  CURLcode result;
  char *auth;
  _Bool proxy_local;
  char *path_local;
  char *request_local;
  auth *authstatus_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pcStack_48 = (char *)0x0;
  if (authstatus->picked == 0x80) {
    pcStack_48 = "AWS_SIGV4";
    CVar1 = Curl_output_aws_sigv4(data,proxy);
  }
  else if (authstatus->picked == 8) {
    pcStack_48 = "NTLM";
    CVar1 = Curl_output_ntlm(data,proxy);
  }
  else {
    if (authstatus->picked != 2) {
      if (authstatus->picked == 1) {
        if ((((proxy) && ((*(ulong *)&(conn->bits).field_0x4 >> 2 & 1) != 0)) &&
            (pcVar2 = Curl_checkProxyheaders(data,conn,"Proxy-authorization"), pcVar2 == (char *)0x0
            )) || (((!proxy && ((*(ulong *)&(conn->bits).field_0x4 >> 0xb & 1) != 0)) &&
                   (pcVar2 = Curl_checkheaders(data,"Authorization"), pcVar2 == (char *)0x0)))) {
          pcStack_48 = "Basic";
          CVar1 = http_output_basic(data,proxy);
          if (CVar1 != CURLE_OK) {
            return CVar1;
          }
        }
        authstatus->field_0x18 = authstatus->field_0x18 & 0xfe | 1;
      }
      goto LAB_00133184;
    }
    pcStack_48 = "Digest";
    CVar1 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
  }
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
LAB_00133184:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && ((data->set).str[0x41] != (char *)0x0)) &&
       (pcVar2 = Curl_checkheaders(data,"Authorization"), pcVar2 == (char *)0x0)) {
      pcStack_48 = "Bearer";
      CVar1 = http_output_bearer(data);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfe | 1;
  }
  if (pcStack_48 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    pcVar2 = "Server";
    if (proxy) {
      pcVar2 = "Proxy";
      if ((data->state).aptr.proxyuser == (char *)0x0) {
        local_70 = "";
      }
      else {
        local_70 = (data->state).aptr.proxyuser;
      }
      local_78 = local_70;
    }
    else {
      if ((data->state).aptr.user == (char *)0x0) {
        local_80 = "";
      }
      else {
        local_80 = (data->state).aptr.user;
      }
      local_78 = local_80;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar2,pcStack_48,local_78);
    authstatus->field_0x18 =
         authstatus->field_0x18 & 0xfd | ((authstatus->field_0x18 & 1) == 0) << 1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, "Proxy-authorization")) ||
#endif
      (!proxy && conn->bits.user_passwd &&
       !Curl_checkheaders(data, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, "Authorization"))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}